

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::IsOff(char *val)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  char *unaff_retaddr;
  char *pcStack_8;
  
  if (val == (char *)0x0) {
    return true;
  }
  bVar1 = *val;
  if (0x65 < bVar1) {
    switch(bVar1) {
    case 0x66:
      goto switchD_001579f9_caseD_46;
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
      goto switchD_001579f9_caseD_47;
    case 0x69:
      goto switchD_001579f9_caseD_49;
    case 0x6e:
      goto switchD_001579f9_caseD_4e;
    case 0x6f:
      goto switchD_001579f9_caseD_4f;
    default:
      goto code_r0x001579a4;
    }
  }
  switch(bVar1) {
  case 0x46:
switchD_001579f9_caseD_46:
    if ((((byte)(val[1] | 0x20U) == 0x61) && ((byte)(val[2] | 0x20U) == 0x6c)) &&
       (((byte)(val[3] | 0x20U) == 0x73 && (((byte)(val[4] | 0x20U) == 0x65 && (val[5] == '\0'))))))
    {
      return true;
    }
    if (bVar1 != 0x49) goto code_r0x001579a4;
    break;
  case 0x47:
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
switchD_001579f9_caseD_47:
    bVar3 = IsNOTFOUND(unaff_retaddr);
    return bVar3;
  case 0x49:
    break;
  case 0x4e:
switchD_001579f9_caseD_4e:
    cVar2 = val[1];
    if (cVar2 == '\0') {
      return true;
    }
    if (((cVar2 == 'o') || (cVar2 == 'O')) && (val[2] == '\0')) {
      return true;
    }
    if (bVar1 != 0x69) {
      if (bVar1 != 0x66) goto code_r0x001579a4;
      goto switchD_001579f9_caseD_46;
    }
    break;
  case 0x4f:
switchD_001579f9_caseD_4f:
    if ((((byte)(val[1] | 0x20U) == 0x66) && ((byte)(val[2] | 0x20U) == 0x66)) && (val[3] == '\0'))
    {
      return true;
    }
    if (bVar1 == 0x66) goto switchD_001579f9_caseD_46;
    if (bVar1 != 0x69) {
      if (bVar1 != 0x6e) goto code_r0x001579a4;
      goto switchD_001579f9_caseD_4e;
    }
    break;
  default:
    if (bVar1 == 0) {
      return true;
    }
    if (bVar1 != 0x30) goto code_r0x001579a4;
    cVar2 = val[1];
    goto joined_r0x00157b27;
  }
switchD_001579f9_caseD_49:
  if (((((byte)(val[1] | 0x20U) == 0x67) && ((byte)(val[2] | 0x20U) == 0x6e)) &&
      ((byte)(val[3] | 0x20U) == 0x6f)) &&
     (((byte)(val[4] | 0x20U) == 0x72 && ((byte)(val[5] | 0x20U) == 0x65)))) {
    cVar2 = val[6];
joined_r0x00157b27:
    if (cVar2 == '\0') {
      return true;
    }
  }
code_r0x001579a4:
  pcStack_8 = val;
  iVar4 = strcmp(val,"NOTFOUND");
  if (iVar4 == 0) {
    bVar3 = true;
  }
  else {
    bVar3 = cmHasLiteralSuffix<char_const*,10ul>(&pcStack_8,(char (*) [10])0x497fb3);
  }
  return bVar3;
}

Assistant:

bool cmSystemTools::IsOff(const char* val)
{
  // ""
  if (!val || val[0] == '\0') {
    return true;
  }
  /* clang-format off */
  // "0"
  if (val[0] == '0' && val[1] == '\0') {
    return true;
  }
  // "OFF"
  if ((val[0] == 'O' || val[0] == 'o') &&
      (val[1] == 'F' || val[1] == 'f') &&
      (val[2] == 'F' || val[2] == 'f') && val[3] == '\0') {
    return true;
  }
  // "N", "NO"
  if ((val[0] == 'N' || val[0] == 'n') && (val[1] == '\0' || (
      (val[1] == 'O' || val[1] == 'o') && val[2] == '\0'))) {
    return true;
  }
  // "FALSE"
  if ((val[0] == 'F' || val[0] == 'f') &&
      (val[1] == 'A' || val[1] == 'a') &&
      (val[2] == 'L' || val[2] == 'l') &&
      (val[3] == 'S' || val[3] == 's') &&
      (val[4] == 'E' || val[4] == 'e') && val[5] == '\0') {
    return true;
  }
  // "IGNORE"
  if ((val[0] == 'I' || val[0] == 'i') &&
      (val[1] == 'G' || val[1] == 'g') &&
      (val[2] == 'N' || val[2] == 'n') &&
      (val[3] == 'O' || val[3] == 'o') &&
      (val[4] == 'R' || val[4] == 'r') &&
      (val[5] == 'E' || val[5] == 'e') && val[6] == '\0') {
    return true;
  }
  /* clang-format on */
  return cmSystemTools::IsNOTFOUND(val);
}